

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_functions.hpp
# Opt level: O1

void test_quadrature<RadialGaussian,IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,double>,IntegratorXX::MurrayHandyLamingRadialTraits<2ul>>>
               (string *msg,
               RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MurrayHandyLamingRadialTraits<2UL>_>
               *quad,double ref,double e)

{
  pointer pcVar1;
  pointer pdVar2;
  ulong uVar3;
  double dVar4;
  StringRef macroName;
  StringRef capturedExpression;
  double res;
  AssertionHandler catchAssertionHandler;
  double local_128;
  double local_120;
  double local_118;
  double local_110;
  string local_108;
  double local_e8;
  undefined8 uStack_e0;
  AssertionHandler local_d8;
  ITransientExpression local_90;
  double *local_80;
  WithinAbsMatcher *local_78;
  WithinAbsMatcher local_70;
  
  local_128 = 0.0;
  pdVar2 = (quad->
           super_Quadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MurrayHandyLamingRadialTraits<2UL>_>_>
           ).
           super_QuadratureBase<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
           .points_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_120 = ref;
  local_118 = e;
  if ((quad->
      super_Quadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MurrayHandyLamingRadialTraits<2UL>_>_>
      ).
      super_QuadratureBase<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
      .points_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish != pdVar2) {
    uVar3 = 0;
    do {
      local_110 = (quad->
                  super_Quadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MurrayHandyLamingRadialTraits<2UL>_>_>
                  ).
                  super_QuadratureBase<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
                  .weights_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar3];
      dVar4 = pdVar2[uVar3];
      local_e8 = dVar4 * dVar4;
      uStack_e0 = 0;
      dVar4 = exp(-dVar4 * dVar4);
      local_128 = dVar4 * local_e8 * local_110 + local_128;
      uVar3 = uVar3 + 1;
      pdVar2 = (quad->
               super_Quadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MurrayHandyLamingRadialTraits<2UL>_>_>
               ).
               super_QuadratureBase<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
               .points_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar3 < (ulong)((long)(quad->
                                   super_Quadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MurrayHandyLamingRadialTraits<2UL>_>_>
                                   ).
                                   super_QuadratureBase<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
                                   .points_.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)pdVar2 >> 3));
  }
  local_70.super_MatcherBase<double>.super_MatcherUntypedBase._vptr_MatcherUntypedBase =
       (_func_int **)0x16f2c9;
  local_70.super_MatcherBase<double>.super_MatcherUntypedBase.m_cachedToString._M_dataplus._M_p =
       (pointer)0x79;
  macroName.m_size = 0xc;
  macroName.m_start = "REQUIRE_THAT";
  capturedExpression.m_size = 0x33;
  capturedExpression.m_start = "res, IntegratorXX::Matchers::WithinAbs(msg, ref, e)";
  Catch::AssertionHandler::AssertionHandler
            (&local_d8,macroName,(SourceLineInfo *)&local_70,capturedExpression,Normal);
  pcVar1 = (msg->_M_dataplus)._M_p;
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_108,pcVar1,pcVar1 + msg->_M_string_length);
  IntegratorXX::Matchers::WithinAbs(&local_70,&local_108,local_120,local_118);
  local_90.m_result = IntegratorXX::Matchers::WithinAbsMatcher::match(&local_70,&local_128);
  local_90.m_isBinaryExpression = true;
  local_90._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_012a9150;
  local_80 = &local_128;
  local_78 = &local_70;
  Catch::AssertionHandler::handleExpr(&local_d8,&local_90);
  Catch::ITransientExpression::~ITransientExpression(&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.m_msg._M_dataplus._M_p != &local_70.m_msg.field_2) {
    operator_delete(local_70.m_msg._M_dataplus._M_p,local_70.m_msg.field_2._M_allocated_capacity + 1
                   );
  }
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  Catch::AssertionHandler::complete(&local_d8);
  if (local_d8.m_completed == false) {
    (*(local_d8.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  return;
}

Assistant:

void test_quadrature(std::string msg, const QuadType& quad, double ref, double e, PreArgs&&... args) {
  const auto& pts = quad.points();
  const auto& wgt = quad.weights();

  double res = 0.0;
  for(auto i = 0; i < quad.npts(); ++i) {
    res += wgt[i] * TestFunction::evaluate(args..., pts[i]);
  }
  
  //standard_matcher(mes, res, ref, e);
  //printf("diff = %.6e\n", std::abs(ref - res));
  REQUIRE_THAT(res, IntegratorXX::Matchers::WithinAbs(msg, ref, e));
}